

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_1::PosixFileLock::~PosixFileLock(PosixFileLock *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_FileLock)._vptr_FileLock = (_func_int **)&PTR__PosixFileLock_00a28fd0;
  std::__cxx11::string::~string((string *)&this->filename_);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    FileLock::~FileLock(&this->super_FileLock);
    return;
  }
  __stack_chk_fail();
}

Assistant:

PosixFileLock(int fd, std::string filename)
      : fd_(fd), filename_(std::move(filename)) {}